

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * y_convolve_8tap_8x2_avx2
                    (uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m128i *s_64,__m256i *ss_256)

{
  undefined1 auVar1 [32];
  __m256i *ss;
  undefined1 auVar2 [32];
  __m256i *palVar3;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  __m256i src78;
  __m256i src67;
  
  *(undefined8 *)(in_RCX + 0x70) = *(undefined8 *)(in_RDI + in_RSI * 7);
  *(undefined8 *)(in_RCX + 0x78) = 0;
  palVar3 = *(__m256i **)(in_RCX + 0x68);
  ss = *(__m256i **)(in_RCX + 0x70);
  auVar2 = *(undefined1 (*) [32])(in_RCX + 0x60);
  *(undefined8 *)(in_RCX + 0x60) = *(undefined8 *)(in_RDI + in_RSI * 8);
  *(undefined8 *)(in_RCX + 0x68) = 0;
  auVar1._16_8_ = *(undefined8 *)(in_RCX + 0x60);
  auVar1._0_16_ = *(undefined1 (*) [16])(in_RCX + 0x70);
  auVar1._24_8_ = *(undefined8 *)(in_RCX + 0x68);
  auVar1 = vpunpcklbw_avx2(auVar2,auVar1);
  *(undefined1 (*) [32])(in_R8 + 0x60) = auVar1;
  palVar3 = convolve_8tap_avx2(ss,palVar3);
  return palVar3;
}

Assistant:

static inline __m256i y_convolve_8tap_8x2_avx2(const uint8_t *const src,
                                               const ptrdiff_t stride,
                                               const __m256i coeffs[4],
                                               __m128i s_64[8],
                                               __m256i ss_256[4]) {
  s_64[7] = _mm_loadl_epi64((__m128i *)(src + 7 * stride));
  const __m256i src67 = _mm256_setr_m128i(s_64[6], s_64[7]);
  s_64[6] = _mm_loadl_epi64((__m128i *)(src + 8 * stride));
  const __m256i src78 = _mm256_setr_m128i(s_64[7], s_64[6]);
  ss_256[3] = _mm256_unpacklo_epi8(src67, src78);
  return convolve_8tap_avx2(ss_256, coeffs);
}